

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O2

void roaring64_bitmap_remove_bulk
               (roaring64_bitmap_t *r,roaring64_bulk_context_t *context,uint64_t val)

{
  container_t *c;
  roaring64_leaf_t *prVar1;
  uint8_t typecode;
  _Bool _Var2;
  int iVar3;
  leaf_t *plVar4;
  container_t *c_00;
  art_val_t *__ptr;
  uint8_t typecode2;
  uint8_t high48 [6];
  uint8_t local_31;
  uint local_30;
  ushort local_2c;
  
  local_30 = (uint)(byte)(val >> 0x38) | ((uint)(val >> 0x20) & 0xff0000) >> 8 |
             (uint)(val >> 0x18) & 0xff0000 | (uint)(val >> 8) & 0xff000000;
  local_2c = (ushort)(val >> 0x18) & 0xff | (ushort)(val >> 8) & 0xff00;
  if ((context->leaf == (roaring64_leaf_t *)0x0) ||
     (iVar3 = art_compare_keys(context->high_bytes,(art_key_chunk_t *)&local_30), iVar3 != 0)) {
    plVar4 = (leaf_t *)art_find(&r->art,(art_key_chunk_t *)&local_30);
    plVar4 = containerptr_roaring64_bitmap_remove(r,(uint8_t *)&local_30,(uint16_t)val,plVar4);
    context->leaf = plVar4;
    *(uint *)context->high_bytes = local_30;
    *(ushort *)(context->high_bytes + 4) = local_2c;
  }
  else {
    c_00 = container_remove(context->leaf->container,(uint16_t)val,context->leaf->typecode,&local_31
                           );
    c = context->leaf->container;
    typecode = local_31;
    if (c_00 != c) {
      container_free(c,context->leaf->typecode);
      prVar1 = context->leaf;
      prVar1->container = c_00;
      prVar1->typecode = local_31;
      typecode = local_31;
    }
    _Var2 = container_nonzero_cardinality(c_00,typecode);
    if (!_Var2) {
      __ptr = art_erase(&r->art,(art_key_chunk_t *)&local_30);
      container_free(c_00,typecode);
      roaring_free(__ptr);
    }
  }
  return;
}

Assistant:

void roaring64_bitmap_remove_bulk(roaring64_bitmap_t *r,
                                  roaring64_bulk_context_t *context,
                                  uint64_t val) {
    art_t *art = &r->art;
    uint8_t high48[ART_KEY_BYTES];
    uint16_t low16 = split_key(val, high48);
    if (context->leaf != NULL &&
        compare_high48(context->high_bytes, high48) == 0) {
        // We're at a container with the correct high bits.
        uint8_t typecode2;
        container_t *container2 =
            container_remove(context->leaf->container, low16,
                             context->leaf->typecode, &typecode2);
        if (container2 != context->leaf->container) {
            container_free(context->leaf->container, context->leaf->typecode);
            context->leaf->container = container2;
            context->leaf->typecode = typecode2;
        }
        if (!container_nonzero_cardinality(container2, typecode2)) {
            leaf_t *leaf = (leaf_t *)art_erase(art, high48);
            container_free(container2, typecode2);
            free_leaf(leaf);
        }
    } else {
        // We're not positioned anywhere yet or the high bits of the key
        // differ.
        leaf_t *leaf = (leaf_t *)art_find(art, high48);
        context->leaf =
            containerptr_roaring64_bitmap_remove(r, high48, low16, leaf);
        memcpy(context->high_bytes, high48, ART_KEY_BYTES);
    }
}